

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# widgets.h
# Opt level: O1

void __thiscall dlib::menu_bar::menu_data::menu_data(menu_data *this)

{
  (this->name)._M_dataplus._M_p = (pointer)&(this->name).field_2;
  (this->name)._M_string_length = 0;
  (this->name).field_2._M_local_buf[0] = 0;
  this->underline_pos = 0xffffffffffffffff;
  popup_menu::popup_menu(&this->menu);
  (this->rect).l = 0;
  (this->rect).t = 0;
  *(undefined4 *)&(this->rect).r = 0xffffffff;
  *(undefined4 *)((long)&(this->rect).r + 4) = 0xffffffff;
  *(undefined4 *)&(this->rect).b = 0xffffffff;
  *(undefined4 *)((long)&(this->rect).b + 4) = 0xffffffff;
  (this->bgrect).l = 0;
  (this->bgrect).t = 0;
  *(undefined4 *)&(this->bgrect).r = 0xffffffff;
  *(undefined4 *)((long)&(this->bgrect).r + 4) = 0xffffffff;
  *(undefined4 *)&(this->bgrect).b = 0xffffffff;
  *(undefined4 *)((long)&(this->bgrect).b + 4) = 0xffffffff;
  (this->underline_p1).
  super_matrix<long,_2L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>.
  data.data[0] = 0;
  (this->underline_p1).
  super_matrix<long,_2L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>.
  data.data[1] = 0;
  (this->underline_p2).
  super_matrix<long,_2L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>.
  data.data[0] = 0;
  (this->underline_p2).
  super_matrix<long,_2L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>.
  data.data[1] = 0;
  return;
}

Assistant:

menu_data():underline_pos(dlib::ustring::npos){}